

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

QPDFFormFieldObjectHelper * __thiscall
QPDFFormFieldObjectHelper::getTopLevelField
          (QPDFFormFieldObjectHelper *__return_storage_ptr__,QPDFFormFieldObjectHelper *this,
          bool *is_different)

{
  QPDFFormFieldObjectHelper *pQVar1;
  bool bVar2;
  QPDFObjGen og;
  QPDFObjectHandle top_field;
  set seen;
  allocator<char> local_b9;
  QPDFFormFieldObjectHelper *local_b8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a0 [32];
  string local_80 [32];
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  local_b8 = __return_storage_ptr__;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_a0);
    bVar2 = QPDFObjGen::set::add((set *)&local_60,og);
    if (!bVar2) break;
    std::__cxx11::string::string<std::allocator<char>>(local_80,"/Parent",&local_b9);
    QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)&local_b0,(string *)local_a0);
    bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__cxx11::string::~string(local_80);
    if (bVar2) break;
    std::__cxx11::string::string<std::allocator<char>>(local_80,"/Parent",&local_b9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_b0,(string *)local_a0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__cxx11::string::~string(local_80);
    if (is_different != (bool *)0x0) {
      *is_different = true;
    }
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
  pQVar1 = local_b8;
  QPDFFormFieldObjectHelper(local_b8,(QPDFObjectHandle *)(local_a0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x18));
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  return pQVar1;
}

Assistant:

QPDFFormFieldObjectHelper
QPDFFormFieldObjectHelper::getTopLevelField(bool* is_different)
{
    auto top_field = oh();
    QPDFObjGen::set seen;
    while (seen.add(top_field) && !top_field.getKeyIfDict("/Parent").isNull()) {
        top_field = top_field.getKey("/Parent");
        if (is_different) {
            *is_different = true;
        }
    }
    return {top_field};
}